

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.hpp
# Opt level: O0

AABox * __thiscall Sphere::boundingVolume(Sphere *this)

{
  long in_RSI;
  AABox *in_RDI;
  AABox *v;
  
  AABox::AABox(in_RDI);
  in_RDI->x1 = *(float *)(in_RSI + 8) - *(float *)(in_RSI + 0x14);
  in_RDI->x2 = *(float *)(in_RSI + 8) + *(float *)(in_RSI + 0x14);
  in_RDI->y1 = *(float *)(in_RSI + 0xc) - *(float *)(in_RSI + 0x14);
  in_RDI->y2 = *(float *)(in_RSI + 0xc) + *(float *)(in_RSI + 0x14);
  in_RDI->z1 = *(float *)(in_RSI + 0x10) - *(float *)(in_RSI + 0x14);
  in_RDI->z2 = *(float *)(in_RSI + 0x10) + *(float *)(in_RSI + 0x14);
  return in_RDI;
}

Assistant:

AABox boundingVolume() const
	{
		AABox v;
		v.x1 = center.x - radius;
		v.x2 = center.x + radius;
		v.y1 = center.y - radius;
		v.y2 = center.y + radius;
		v.z1 = center.z - radius;
		v.z2 = center.z + radius;
		return v;
	}